

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_immediately_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 this;
  pointer __p;
  bool bVar1;
  FILE *__stream;
  size_type __n;
  size_t sVar2;
  tuple<google::CapturedStream_*,_std::default_delete<google::CapturedStream>_> tVar3;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> cap;
  allocator_type local_b9;
  undefined1 local_b8 [8];
  string early_stderr;
  vector<char,_std::allocator<char>_> content;
  
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  setbuf(_stderr,(char *)0x0);
  std::operator+(&early_stderr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,"/captured.err");
  cap._M_t.
  super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>._M_t.
  super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>.
  super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl._0_4_ = 2;
  if (google::s_captured_streams._16_8_ == 0) {
    std::make_unique<google::CapturedStream,int&,std::__cxx11::string_const&>
              ((int *)&content,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cap);
    __p = content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
    content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::__uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
    reset((__uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_> *)
          (google::s_captured_streams +
          (long)(int)cap._M_t.
                     super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                     .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl * 8),
          (pointer)__p);
    std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
    ~unique_ptr((unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> *)
                &content);
    std::__cxx11::string::~string((string *)&early_stderr);
    this = google::s_captured_streams._16_8_;
    cap._M_t.
    super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>._M_t
    .super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>.
    super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
          )(__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
            )google::s_captured_streams._16_8_;
    google::s_captured_streams._16_8_ = 0;
    if (this != 0) {
      google::CapturedStream::StopCapture((CapturedStream *)this);
      __stream = fopen(*(char **)((long)cap._M_t.
                                        super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                                        .super__Head_base<0UL,_google::CapturedStream_*,_false>.
                                        _M_head_impl + 8),"r");
      local_b8 = (undefined1  [8])__stream;
      fseek(__stream,0,2);
      __n = ftell(__stream);
      std::vector<char,_std::allocator<char>_>::vector(&content,__n,&local_b9);
      uVar7 = 0;
      fseek(__stream,0,0);
      do {
        sVar2 = fread(content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar7,1,__n - uVar7,__stream);
        uVar7 = uVar7 + sVar2;
        if (sVar2 == 0) break;
      } while (uVar7 < __n);
      early_stderr._M_dataplus._M_p = (pointer)&early_stderr.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&early_stderr,
                 content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7);
      free(content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start);
      std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
                ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)local_b8,(pointer)0x0)
      ;
      std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::~unique_ptr
                ((unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_> *)local_b8);
      std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
      ~unique_ptr(&cap);
      bVar1 = google::IsGoogleLoggingInitialized();
      if (bVar1) {
        pcVar5 = "!(IsGoogleLoggingInitialized())";
      }
      else {
        google::InitGoogleLogging(*argv);
        bVar1 = google::IsGoogleLoggingInitialized();
        if (bVar1) {
          lVar6 = -(long)google::g_testlist;
          for (puVar8 = google::g_testlist; puVar8 != DAT_0012ea48; puVar8 = puVar8 + 1) {
            (*(code *)*puVar8)();
            lVar6 = lVar6 + -8;
          }
          fprintf(_stderr,"Passed %d tests\n\nPASS\n",
                  (ulong)-(lVar6 + (long)google::g_testlist) >> 3 & 0xffffffff);
          tVar3.
          super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
          .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                )google::Check_EQImpl_abi_cxx11_(0,0,"RUN_ALL_TESTS() == 0");
          if (tVar3.
              super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
              .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl ==
              (_Head_base<0UL,_google::CapturedStream_*,_false>)0x0) {
            std::__cxx11::string::~string((string *)&early_stderr);
            return 0;
          }
          cap._M_t.
          super___uniq_ptr_impl<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
          .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl =
               (__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                )(__uniq_ptr_data<google::CapturedStream,_std::default_delete<google::CapturedStream>,_true,_true>
                  )tVar3.
                   super__Tuple_impl<0UL,_google::CapturedStream_*,_std::default_delete<google::CapturedStream>_>
                   .super__Head_base<0UL,_google::CapturedStream_*,_false>._M_head_impl;
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&content,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/cleanup_immediately_unittest.cc"
                     ,0x5f,(CheckOpString *)&cap);
          google::LogMessage::stream((LogMessage *)&content);
          goto LAB_00108be9;
        }
        pcVar5 = "IsGoogleLoggingInitialized()";
      }
      fprintf(_stderr,"Check failed: %s\n",pcVar5);
      exit(1);
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&content,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x183);
    poVar4 = google::LogMessage::stream((LogMessage *)&content);
    poVar4 = std::operator<<(poVar4,"Check failed: cap ");
    std::operator<<(poVar4,": did you forget CaptureTestStdout() or CaptureTestStderr()?");
  }
  else {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&content,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    poVar4 = google::LogMessage::stream((LogMessage *)&content);
    std::operator<<(poVar4,"Check failed: s_captured_streams[fd] == nullptr ");
  }
LAB_00108be9:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&content);
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;
#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  InitGoogleLogging(argv[0]);

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);
}